

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall rsg::Shader::~Shader(Shader *this)

{
  Function *this_00;
  pointer ppFVar1;
  pointer ppSVar2;
  pointer ppFVar3;
  pointer ppSVar4;
  
  for (ppFVar3 = (this->m_functions).
                 super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppFVar3 !=
      (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    this_00 = *ppFVar3;
    if (this_00 != (Function *)0x0) {
      Function::~Function(this_00);
    }
    operator_delete(this_00,0xe0);
  }
  ppFVar1 = (this->m_functions).
            super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar3 != ppFVar1) {
    (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  for (ppSVar4 = (this->m_globalStatements).
                 super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar4 !=
      (this->m_globalStatements).
      super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    if (*ppSVar4 != (Statement *)0x0) {
      (*(*ppSVar4)->_vptr_Statement[1])();
    }
  }
  ppSVar2 = (this->m_globalStatements).
            super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 != ppSVar2) {
    (this->m_globalStatements).
    super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2;
  }
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_inputs);
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_uniforms);
  std::__cxx11::string::~string((string *)&this->m_source);
  Function::~Function(&this->m_mainFunction);
  std::_Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>::~_Vector_base
            (&(this->m_functions).
              super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>);
  std::_Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~_Vector_base
            (&(this->m_uniforms).
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>);
  std::_Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~_Vector_base
            (&(this->m_inputs).
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>);
  std::_Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::~_Vector_base
            (&(this->m_globalStatements).
              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>);
  VariableScope::~VariableScope(&this->m_globalScope);
  return;
}

Assistant:

Shader::~Shader (void)
{
	deleteVectorElements(m_functions);
	deleteVectorElements(m_globalStatements);
	deleteVectorElements(m_inputs);
	deleteVectorElements(m_uniforms);
}